

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_log_callback ma_log_callback_init(ma_log_callback_proc onLog,void *pUserData)

{
  ma_log_callback mVar1;
  
  mVar1.pUserData = pUserData;
  mVar1.onLog = onLog;
  return mVar1;
}

Assistant:

MA_API ma_log_callback ma_log_callback_init(ma_log_callback_proc onLog, void* pUserData)
{
    ma_log_callback callback;

    MA_ZERO_OBJECT(&callback);
    callback.onLog     = onLog;
    callback.pUserData = pUserData;

    return callback;
}